

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O0

void * Kernel::FlatTerm::operator_new(size_t sz,uint num)

{
  void *pvVar1;
  undefined4 in_ESI;
  size_t size;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar1 = Lib::alloc(CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return pvVar1;
}

Assistant:

void* FlatTerm::operator new(size_t sz,unsigned num)
{
  ASS_GE(num,0);
  ASS_EQ(sz, sizeof(FlatTerm));

  //one entry is already accounted for in the size of the FlatTerm object
  size_t size = sizeof(FlatTerm);
  if (num > 0) {
    size += (num-1)*sizeof(Entry);
  }

  return ALLOC_KNOWN(size,"FlatTerm");
}